

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint ensureBits17(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = reader->size;
  uVar2 = reader->bp;
  uVar3 = uVar2 >> 3;
  if (uVar3 + 2 < uVar1) {
    reader->buffer =
         (uint)(uint3)(CONCAT12(reader->data[uVar3 + 2],*(undefined2 *)(reader->data + uVar3)) >>
                      ((byte)uVar2 & 7));
    return 1;
  }
  reader->buffer = 0;
  uVar4 = 0;
  if (uVar3 < uVar1) {
    uVar4 = (uint)reader->data[uVar3];
    reader->buffer = (uint)reader->data[uVar3];
  }
  if (uVar3 + 1 < uVar1) {
    uVar4 = uVar4 | (uint)reader->data[uVar3 + 1] << 8;
  }
  reader->buffer = uVar4 >> ((byte)uVar2 & 7);
  return (uint)(nbits + uVar2 <= reader->bitsize);
}

Assistant:

static unsigned ensureBits17(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 2u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u) |
                     ((unsigned)reader->data[start + 2] << 16u);
    reader->buffer >>= (reader->bp & 7u);
    return 1;
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer |= reader->data[start + 0];
    if(start + 1u < size) reader->buffer |= ((unsigned)reader->data[start + 1] << 8u);
    reader->buffer >>= (reader->bp & 7u);
    return reader->bp + nbits <= reader->bitsize;
  }
}